

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O2

Camera * rw::Camera::streamRead(Stream *stream)

{
  FILE *__stream;
  bool bVar1;
  Camera *this;
  char *pcVar2;
  CameraChunkData buf;
  
  bVar1 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
  if (bVar1) {
    Stream::read32(stream,&buf,0x20);
    this = create();
    this->viewWindow = buf.viewWindow;
    this->viewOffset = buf.viewOffset;
    this->nearPlane = buf.nearPlane;
    this->farPlane = buf.farPlane;
    this->fogPlane = buf.fogPlane;
    this->projection = buf.projection;
    bVar1 = PluginList::streamRead((PluginList *)&s_plglist,stream,this);
    if (!bVar1) {
      destroy(this);
      this = (Camera *)0x0;
    }
  }
  else {
    buf.viewWindow.x = 7.00649e-45;
    buf.viewWindow.y = -5.60519e-45;
    this = (Camera *)0x0;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/camera.cpp"
            ,0x1c8);
    __stream = _stderr;
    pcVar2 = dbgsprint(0x80000004,"STRUCT");
    fprintf(__stream,"%s\n",pcVar2);
    setError((Error *)&buf);
  }
  return this;
}

Assistant:

Camera*
Camera::streamRead(Stream *stream)
{
	CameraChunkData buf;
	if(!findChunk(stream, ID_STRUCT, nil, nil)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	stream->read32(&buf, sizeof(CameraChunkData));
	Camera *cam = Camera::create();
	cam->viewWindow = buf.viewWindow;
	cam->viewOffset = buf.viewOffset;
	cam->nearPlane = buf.nearPlane;
	cam->farPlane = buf.farPlane;
	cam->fogPlane = buf.fogPlane;
	cam->projection = buf.projection;
	if(s_plglist.streamRead(stream, cam))
		return cam;
	cam->destroy();
	return nil;
}